

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void identPut(char *z,int *pIdx,char *zSignedIdent)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_30;
  int needQuote;
  int j;
  int i;
  uchar *zIdent;
  char *zSignedIdent_local;
  int *pIdx_local;
  char *z_local;
  
  iVar1 = *pIdx;
  for (local_30 = 0;
      (zSignedIdent[local_30] != '\0' &&
      (((""[(byte)zSignedIdent[local_30]] & 6) != 0 || (zSignedIdent[local_30] == '_'))));
      local_30 = local_30 + 1) {
  }
  bVar3 = true;
  if ((""[(byte)*zSignedIdent] & 4) == 0) {
    iVar2 = sqlite3KeywordCode((uchar *)zSignedIdent,local_30);
    bVar3 = true;
    if ((iVar2 == 0x1b) && (bVar3 = true, zSignedIdent[local_30] == '\0')) {
      bVar3 = local_30 == 0;
    }
  }
  needQuote = iVar1;
  if (bVar3) {
    needQuote = iVar1 + 1;
    z[iVar1] = '\"';
  }
  for (local_30 = 0; zSignedIdent[local_30] != '\0'; local_30 = local_30 + 1) {
    z[needQuote] = zSignedIdent[local_30];
    iVar1 = needQuote + 1;
    if (zSignedIdent[local_30] == '\"') {
      z[needQuote + 1] = '\"';
      iVar1 = needQuote + 2;
    }
    needQuote = iVar1;
  }
  if (bVar3) {
    z[needQuote] = '\"';
    needQuote = needQuote + 1;
  }
  z[needQuote] = '\0';
  *pIdx = needQuote;
  return;
}

Assistant:

static void identPut(char *z, int *pIdx, char *zSignedIdent){
  unsigned char *zIdent = (unsigned char*)zSignedIdent;
  int i, j, needQuote;
  i = *pIdx;

  for(j=0; zIdent[j]; j++){
    if( !sqlite3Isalnum(zIdent[j]) && zIdent[j]!='_' ) break;
  }
  needQuote = sqlite3Isdigit(zIdent[0])
            || sqlite3KeywordCode(zIdent, j)!=TK_ID
            || zIdent[j]!=0
            || j==0;

  if( needQuote ) z[i++] = '"';
  for(j=0; zIdent[j]; j++){
    z[i++] = zIdent[j];
    if( zIdent[j]=='"' ) z[i++] = '"';
  }
  if( needQuote ) z[i++] = '"';
  z[i] = 0;
  *pIdx = i;
}